

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int udp_check_url(nng_url *url,_Bool listen)

{
  int iVar1;
  size_t sVar2;
  _Bool listen_local;
  nng_url *url_local;
  
  sVar2 = strlen(url->u_path);
  if ((sVar2 == 0) || (iVar1 = strcmp(url->u_path,"/"), iVar1 == 0)) {
    if (((url->u_fragment == (char *)0x0) && (url->u_userinfo == (char *)0x0)) &&
       (url->u_query == (char *)0x0)) {
      if ((listen) || ((sVar2 = strlen(url->u_hostname), sVar2 != 0 && (url->u_port != 0)))) {
        url_local._4_4_ = 0;
      }
      else {
        url_local._4_4_ = 0xf;
      }
    }
    else {
      url_local._4_4_ = 0xf;
    }
  }
  else {
    url_local._4_4_ = 0xf;
  }
  return url_local._4_4_;
}

Assistant:

static int
udp_check_url(nng_url *url, bool listen)
{
	// Check for invalid URL components.
	if ((strlen(url->u_path) != 0) && (strcmp(url->u_path, "/") != 0)) {
		return (NNG_EADDRINVAL);
	}
	if ((url->u_fragment != NULL) || (url->u_userinfo != NULL) ||
	    (url->u_query != NULL)) {
		return (NNG_EADDRINVAL);
	}
	if (!listen) {
		if ((strlen(url->u_hostname) == 0) || (url->u_port == 0)) {
			return (NNG_EADDRINVAL);
		}
	}
	return (0);
}